

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeProcesses.cpp
# Opt level: O3

void __thiscall adios2::shm::SerializeProcesses::~SerializeProcesses(SerializeProcesses *this)

{
  _Alloc_hider _Var1;
  string local_30;
  
  if (this->m_nProc < 2) {
    _Var1._M_p = (pointer)this->m_ShmValue;
  }
  else {
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    helper::Comm::Win_free(this->m_NodeComm,&this->m_Win,&local_30);
    _Var1._M_p = local_30._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) goto LAB_0064295b;
  }
  operator_delete(_Var1._M_p);
LAB_0064295b:
  helper::Comm::Win::~Win(&this->m_Win);
  return;
}

Assistant:

SerializeProcesses::~SerializeProcesses()
{
    if (m_nProc > 1)
    {
        m_NodeComm->Win_free(m_Win);
    }
    else
    {
        delete m_ShmValue;
    }
}